

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

int __thiscall AGSMock::MockEngine::IncrementManagedObjectRefCount(MockEngine *this,char *address)

{
  size_type sVar1;
  mapped_type *pmVar2;
  char *local_30;
  char *local_28;
  char *local_20;
  char *address_local;
  MockEngine *this_local;
  
  local_28 = address;
  local_20 = address;
  address_local = (char *)this;
  sVar1 = std::
          unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
          ::count(&this->data_->objects,&local_28);
  if (sVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    local_30 = local_20;
    pmVar2 = std::
             unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
             ::operator[](&this->data_->objects,&local_30);
    this_local._4_4_ = pmVar2->count + 1;
    pmVar2->count = this_local._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int MockEngine::IncrementManagedObjectRefCount(const char *address)
{
	if (data_->objects.count((void *) address) < 1)
		return 0;

	return ++data_->objects[(void *) address].count;
}